

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void initEndData(chainEndData_t *ed)

{
  ed->ambigO[6] = (atom *)0x0;
  ed->ambigO[7] = (atom *)0x0;
  ed->ambigO[4] = (atom *)0x0;
  ed->ambigO[5] = (atom *)0x0;
  ed->ambigO[2] = (atom *)0x0;
  ed->ambigO[3] = (atom *)0x0;
  ed->ambigO[0] = (atom *)0x0;
  ed->ambigO[1] = (atom *)0x0;
  ed->ambigN[6] = (atom *)0x0;
  ed->ambigN[7] = (atom *)0x0;
  ed->ambigN[4] = (atom *)0x0;
  ed->ambigN[5] = (atom *)0x0;
  ed->ambigN[2] = (atom *)0x0;
  ed->ambigN[3] = (atom *)0x0;
  ed->ambigN[0] = (atom *)0x0;
  ed->ambigN[1] = (atom *)0x0;
  ed->res_mc_oxy_cnt = 0;
  ed->first = 0;
  ed->last = 0;
  ed->Ntmarkers = 0;
  ed->Ctmarkers = 0;
  ed->hisNHcount[0] = 0;
  ed->hisNHcount[1] = 0;
  ed->hisNHcount[2] = 0;
  ed->hisNHcount[3] = 0;
  return;
}

Assistant:

void initEndData(chainEndData_t *ed)
{
   int i = 0;
   for (i = 0; i < 8; i++) { ed->ambigN[i] = NULL; ed->ambigO[i] = NULL; }
   ed->res_mc_oxy_cnt = 0;
   ed->first = 0;
   ed->last  = 0;
   ed->Ntmarkers = 0;
   ed->Ctmarkers = 0;
   for (i = 0; i < 4; i++) { ed->hisNHcount[i] = 0; }
}